

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteGraph.cpp
# Opt level: O0

RWBBlock *
dg::dda::splitBlockOnFirstCall
          (RWBBlock *block,
          vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
          *newblocks)

{
  bool bVar1;
  RWNodeCall *pRVar2;
  BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode> *in_RDI;
  pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
  blks;
  RWNodeCall *call;
  RWNode *node;
  iterator __end2;
  iterator __begin2;
  NodesT *__range2;
  NodeT *in_stack_00000060;
  RWBBlock *in_stack_00000068;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  RWNode *in_stack_ffffffffffffffb0;
  _Self local_30;
  _Self local_28;
  NodesT *local_20;
  pointer local_8;
  
  local_20 = BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode>::getNodes_abi_cxx11_(in_RDI);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                 ((list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                  CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                 ((list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                  CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return (RWBBlock *)0x0;
    }
    std::_List_iterator<dg::dda::RWNode_*>::operator*((_List_iterator<dg::dda::RWNode_*> *)0x16aa7d)
    ;
    pRVar2 = RWNodeCall::get(in_stack_ffffffffffffffb0);
    if ((pRVar2 != (RWNodeCall *)0x0) &&
       (bVar1 = RWNodeCall::callsOneUndefined((RWNodeCall *)0x16aaaa), !bVar1)) break;
    std::_List_iterator<dg::dda::RWNode_*>::operator++(&local_28);
  }
  RWBBlock::splitAround(in_stack_00000068,in_stack_00000060);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
                     0x16aad3);
  if (bVar1) {
    std::
    vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
    ::push_back((vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
                 *)in_stack_ffffffffffffffb0,
                (value_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
                     0x16aaf6);
  if (bVar1) {
    std::
    vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
    ::push_back((vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
                 *)in_stack_ffffffffffffffb0,
                (value_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    std::
    vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
    ::back((vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
            *)in_stack_ffffffffffffffb0);
    local_8 = std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>::get
                        ((unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
                         0x16ab21);
  }
  else {
    local_8 = (pointer)0x0;
  }
  std::
  pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
  ::~pair((pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
           *)in_stack_ffffffffffffffb0);
  return local_8;
}

Assistant:

static RWBBlock *
splitBlockOnFirstCall(RWBBlock *block,
                      std::vector<std::unique_ptr<RWBBlock>> &newblocks) {
    for (auto *node : block->getNodes()) {
        if (auto *call = RWNodeCall::get(node)) {
            if (call->callsOneUndefined()) {
                // ignore calls that call one udefined function,
                // those behave just like usual read/write
                continue;
            }
            DBG(dda, "Splitting basic block around " << node->getID());
            auto blks = block->splitAround(node);
            if (blks.first)
                newblocks.push_back(std::move(blks.first));
            if (blks.second) {
                newblocks.push_back(std::move(blks.second));
                return newblocks.back().get();
            }
            return nullptr;
        }
    }
    return nullptr;
}